

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.hpp
# Opt level: O1

void __thiscall
OpenMD::TruncatedCube::TruncatedCube(TruncatedCube *this,string *lattice,int cells,int planes)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (lattice->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + lattice->_M_string_length);
  Cuboctahedron::Cuboctahedron(&this->super_Cuboctahedron,&local_48,cells,planes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_Cuboctahedron)._vptr_Cuboctahedron = (_func_int **)&PTR__Cuboctahedron_0022aa10;
  return;
}

Assistant:

TruncatedCube(std::string lattice, int cells, int planes) :
        Cuboctahedron(lattice, cells, planes) {}